

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sais.hxx
# Opt level: O1

void saisxx_private::
     induceSA<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,int>
               (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                T,__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> SA,
               __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> C,
               __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> B,int n,int k)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  bool bVar4;
  uint *puVar5;
  long lVar6;
  long lVar7;
  int iVar8;
  ulong uVar9;
  int *piVar10;
  ulong uVar11;
  uint uVar12;
  ulong uVar13;
  uint uVar14;
  
  uVar13 = (ulong)(uint)k;
  if (C._M_current == B._M_current) {
    if (0 < k) {
      memset(C._M_current,0,uVar13 * 4);
    }
    if (0 < n) {
      uVar9 = 0;
      do {
        C._M_current[T._M_current[uVar9]] = C._M_current[T._M_current[uVar9]] + 1;
        uVar9 = uVar9 + 1;
      } while ((uint)n != uVar9);
    }
  }
  if (0 < k) {
    uVar9 = 0;
    iVar8 = 0;
    do {
      iVar1 = C._M_current[uVar9];
      B._M_current[uVar9] = iVar8;
      uVar9 = uVar9 + 1;
      iVar8 = iVar1 + iVar8;
    } while (uVar13 != uVar9);
  }
  uVar3 = n - 1;
  uVar9 = (ulong)T._M_current[(long)n + -1];
  iVar8 = B._M_current[uVar9];
  uVar12 = uVar3;
  if ((1 < n) && (uVar12 = -n, T._M_current[(long)n + -1] <= T._M_current[(ulong)(uint)n - 2])) {
    uVar12 = uVar3;
  }
  SA._M_current[iVar8] = uVar12;
  if (0 < n) {
    puVar5 = (uint *)(SA._M_current + iVar8 + 1);
    uVar11 = 0;
    do {
      uVar12 = SA._M_current[uVar11];
      SA._M_current[uVar11] = ~uVar12;
      if (0 < (long)(int)uVar12) {
        uVar14 = uVar12 - 1;
        uVar2 = T._M_current[uVar14];
        if (uVar2 != (uint)uVar9) {
          B._M_current[uVar9] = (int)((ulong)((long)puVar5 - (long)SA._M_current) >> 2);
          puVar5 = (uint *)(SA._M_current + B._M_current[uVar2]);
          uVar9 = (ulong)uVar2;
        }
        if ((uVar12 != 1) && (T._M_current[(long)(int)uVar12 + -2] < (uint)uVar9)) {
          uVar14 = -uVar12;
        }
        *puVar5 = uVar14;
        puVar5 = puVar5 + 1;
      }
      uVar11 = uVar11 + 1;
    } while ((uint)n != uVar11);
  }
  if (C._M_current == B._M_current) {
    if (0 < k) {
      memset(C._M_current,0,uVar13 * 4);
    }
    if (0 < n) {
      uVar9 = 0;
      do {
        C._M_current[T._M_current[uVar9]] = C._M_current[T._M_current[uVar9]] + 1;
        uVar9 = uVar9 + 1;
      } while ((uint)n != uVar9);
    }
  }
  if (0 < k) {
    uVar9 = 0;
    iVar8 = 0;
    do {
      iVar8 = iVar8 + C._M_current[uVar9];
      B._M_current[uVar9] = iVar8;
      uVar9 = uVar9 + 1;
    } while (uVar13 != uVar9);
  }
  if (0 < n) {
    piVar10 = SA._M_current + *B._M_current;
    uVar13 = 0;
    lVar6 = (ulong)uVar3 + 1;
    do {
      uVar3 = SA._M_current[lVar6 + -1];
      uVar12 = (uint)uVar13;
      if ((long)(int)uVar3 < 1) {
        SA._M_current[lVar6 + -1] = ~uVar3;
      }
      else {
        uVar14 = uVar3 - 1;
        uVar2 = T._M_current[uVar14];
        if (uVar2 != uVar12) {
          B._M_current[uVar13] = (int)((ulong)((long)piVar10 - (long)SA._M_current) >> 2);
          piVar10 = SA._M_current + B._M_current[uVar2];
          uVar12 = uVar2;
        }
        if ((uVar14 == 0) || (uVar12 < T._M_current[(long)(int)uVar3 + -2])) {
          uVar14 = -uVar3;
        }
        piVar10[-1] = uVar14;
        piVar10 = piVar10 + -1;
      }
      uVar13 = (ulong)uVar12;
      lVar7 = lVar6 + -1;
      bVar4 = 0 < lVar6;
      lVar6 = lVar7;
    } while (lVar7 != 0 && bVar4);
  }
  return;
}

Assistant:

void
induceSA(string_type T, sarray_type SA, bucket_type C, bucket_type B,
         index_type n, index_type k) {
typedef typename std::iterator_traits<string_type>::value_type char_type;
  sarray_type b;
  index_type i, j;
  char_type c0, c1;
  /* compute SAl */
  if(C == B) { getCounts(T, C, n, k); }
  getBuckets(C, B, k, false); /* find starts of buckets */
  b = SA + B[c1 = T[j = n - 1]];
  *b++ = ((0 < j) && (T[j - 1] < c1)) ? ~j : j;
  for(i = 0; i < n; ++i) {
    j = SA[i], SA[i] = ~j;
    if(0 < j) {
      if((c0 = T[--j]) != c1) { B[c1] = b - SA; b = SA + B[c1 = c0]; }
      *b++ = ((0 < j) && (T[j - 1] < c1)) ? ~j : j;
    }
  }
  /* compute SAs */
  if(C == B) { getCounts(T, C, n, k); }
  getBuckets(C, B, k, true); /* find ends of buckets */
  for(i = n - 1, b = SA + B[c1 = 0]; 0 <= i; --i) {
    if(0 < (j = SA[i])) {
      if((c0 = T[--j]) != c1) { B[c1] = b - SA; b = SA + B[c1 = c0]; }
      *--b = ((j == 0) || (T[j - 1] > c1)) ? ~j : j;
    } else {
      SA[i] = ~j;
    }
  }
}